

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2ThreadTest::TexImage2D::TexImage2D
          (TexImage2D *this,SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,GLint level,
          GLint internalFormat,GLsizei width,GLsizei height,GLenum format,GLenum type,bool useSync,
          bool serverSync)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  Texture *pTVar3;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_40;
  
  Operation::Operation(&this->super_Operation,"TexImage2D",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation = (_func_int **)&PTR__TexImage2D_003e6c90;
  local_40.m_ptr = &texture->m_ptr->super_Object;
  (this->m_texture).m_ptr = (Texture *)local_40.m_ptr;
  pSVar2 = texture->m_state;
  (this->m_texture).m_state = pSVar2;
  if (pSVar2 == (SharedPtrStateBase *)0x0) {
    local_40.m_state = (SharedPtrStateBase *)0x0;
  }
  else {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_texture).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    local_40.m_ptr = &((this->m_texture).m_ptr)->super_Object;
    local_40.m_state = (this->m_texture).m_state;
  }
  this->m_level = level;
  this->m_internalFormat = internalFormat;
  this->m_width = width;
  this->m_height = height;
  this->m_format = format;
  this->m_type = type;
  if (local_40.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_40.m_state)->strongRefCount = (local_40.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_40.m_state)->weakRefCount = (local_40.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_40);
  pSVar2 = local_40.m_state;
  if (local_40.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_40.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_40.m_ptr = (Object *)0x0;
      (*(local_40.m_state)->_vptr_SharedPtrStateBase[2])(local_40.m_state);
    }
    LOCK();
    pdVar1 = &pSVar2->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_40.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_40.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_40.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  ((this->m_texture).m_ptr)->isDefined = true;
  pTVar3 = texture->m_ptr;
  pSVar2 = (pTVar3->sourceImage).m_state;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar2->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (pTVar3->sourceImage).m_ptr = (EGLImage *)0x0;
      (*((pTVar3->sourceImage).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((pTVar3->sourceImage).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar2 = (pTVar3->sourceImage).m_state;
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        (*pSVar2->_vptr_SharedPtrStateBase[1])();
      }
      (pTVar3->sourceImage).m_state = (SharedPtrStateBase *)0x0;
    }
    (pTVar3->sourceImage).m_ptr = (EGLImage *)0x0;
    (pTVar3->sourceImage).m_state = (SharedPtrStateBase *)0x0;
  }
  return;
}

Assistant:

TexImage2D::TexImage2D (SharedPtr<Texture> texture, GLint level, GLint internalFormat, GLsizei width, GLsizei height, GLenum format, GLenum type, bool useSync, bool serverSync)
	: Operation			("TexImage2D", useSync, serverSync)
	, m_texture			(texture)
	, m_level			(level)
	, m_internalFormat	(internalFormat)
	, m_width			(width)
	, m_height			(height)
	, m_format			(format)
	, m_type			(type)
{
	modifyGLObject(SharedPtr<Object>(m_texture));
	m_texture->isDefined = true;

	// Orphang texture
	texture->sourceImage = SharedPtr<EGLImage>();
}